

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

int reportProcessingInstruction(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  int iVar1;
  char *pcVar2;
  XML_Char *pXVar3;
  XML_Char *s;
  char *tem;
  XML_Char *data;
  XML_Char *target;
  char *end_local;
  char *start_local;
  ENCODING *enc_local;
  XML_Parser parser_local;
  
  if (parser->m_processingInstructionHandler == (XML_ProcessingInstructionHandler)0x0) {
    if (parser->m_defaultHandler != (XML_DefaultHandler)0x0) {
      reportDefault(parser,enc,start,end);
    }
    parser_local._4_4_ = 1;
  }
  else {
    pcVar2 = start + (enc->minBytesPerChar << 1);
    iVar1 = (*enc->nameLength)(enc,pcVar2);
    pXVar3 = poolStoreString(&parser->m_tempPool,enc,pcVar2,pcVar2 + iVar1);
    if (pXVar3 == (XML_Char *)0x0) {
      parser_local._4_4_ = 0;
    }
    else {
      (parser->m_tempPool).start = (parser->m_tempPool).ptr;
      pcVar2 = (*enc->skipS)(enc,pcVar2 + iVar1);
      s = poolStoreString(&parser->m_tempPool,enc,pcVar2,end + -(long)(enc->minBytesPerChar << 1));
      if (s == (XML_Char *)0x0) {
        parser_local._4_4_ = 0;
      }
      else {
        normalizeLines(s);
        (*parser->m_processingInstructionHandler)(parser->m_handlerArg,pXVar3,s);
        poolClear(&parser->m_tempPool);
        parser_local._4_4_ = 1;
      }
    }
  }
  return parser_local._4_4_;
}

Assistant:

static int
reportProcessingInstruction(XML_Parser parser, const ENCODING *enc,
                            const char *start, const char *end)
{
  const XML_Char *target;
  XML_Char *data;
  const char *tem;
  if (!parser->m_processingInstructionHandler) {
    if (parser->m_defaultHandler)
      reportDefault(parser, enc, start, end);
    return 1;
  }
  start += enc->minBytesPerChar * 2;
  tem = start + XmlNameLength(enc, start);
  target = poolStoreString(&parser->m_tempPool, enc, start, tem);
  if (!target)
    return 0;
  poolFinish(&parser->m_tempPool);
  data = poolStoreString(&parser->m_tempPool, enc,
                        XmlSkipS(enc, tem),
                        end - enc->minBytesPerChar*2);
  if (!data)
    return 0;
  normalizeLines(data);
  parser->m_processingInstructionHandler(parser->m_handlerArg, target, data);
  poolClear(&parser->m_tempPool);
  return 1;
}